

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshAssignWeights
              (word *t,char *pIsop,char *pIsopFneg,int nVars,int *pW,int *pChow,int nChows,int Wmin)

{
  bool bVar1;
  long lVar2;
  int *__ptr;
  size_t sVar3;
  size_t sVar4;
  unsigned_long **pGreaters;
  unsigned_long *puVar5;
  unsigned_long **pSmallers;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  int Cost;
  int iVar13;
  int iVar14;
  int Cost_1;
  uint nInequalities;
  int iVar15;
  int i;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int in_stack_ffffffffffffff68;
  
  lVar2 = (long)nChows;
  __ptr = (int *)malloc(lVar2 * 4);
  sVar3 = strlen(pIsop);
  uVar16 = (ulong)(nVars + 3);
  sVar4 = strlen(pIsopFneg);
  nInequalities = (int)(sVar4 / uVar16) * (int)(sVar3 / uVar16);
  pGreaters = (unsigned_long **)malloc((long)(int)nInequalities * 8);
  uVar8 = (ulong)nInequalities;
  if (0 < (int)nInequalities) {
    uVar17 = 0;
    do {
      puVar5 = (unsigned_long *)malloc(lVar2 * 8);
      pGreaters[uVar17] = puVar5;
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar8);
  }
  pSmallers = (unsigned_long **)malloc((long)(int)nInequalities * 8);
  if (0 < (int)nInequalities) {
    uVar17 = 0;
    do {
      puVar5 = (unsigned_long *)malloc(lVar2 * 8);
      pSmallers[uVar17] = puVar5;
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar8);
  }
  Extra_ThreshCreateInequalities
            (pIsop,pIsopFneg,nVars,(int *)pSmallers,pChow,nChows,in_stack_ffffffffffffff68,pGreaters
             ,pSmallers);
  Extra_ThreshSimplifyInequalities(nInequalities,nChows,pGreaters,pSmallers);
  *__ptr = Wmin;
  uVar17 = (ulong)(uint)nChows;
  if (1 < nChows) {
    iVar6 = *__ptr;
    uVar9 = 1;
    do {
      __ptr[uVar9] = iVar6 + (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar17 != uVar9);
  }
  if (0 < nChows) {
    uVar9 = 0;
    bVar1 = false;
    iVar6 = -1000;
    piVar10 = __ptr;
    lVar11 = lVar2;
    do {
      if (nVars * 2 < __ptr[lVar2 + -1]) break;
      if (0 < (int)nInequalities) {
        iVar12 = 0;
        do {
          if (pGreaters[iVar12][uVar9] == 0) {
LAB_0081a7d4:
            iVar12 = iVar12 + 1;
          }
          else {
            uVar18 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + __ptr[uVar18] * (int)pGreaters[iVar12][uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
            uVar18 = 0;
            iVar15 = 0;
            do {
              iVar15 = iVar15 + __ptr[uVar18] * (int)pSmallers[iVar12][uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
            iVar14 = iVar13 - iVar15;
            if (iVar14 == 0 || iVar13 < iVar15) {
              if (iVar6 < iVar14) {
                lVar7 = 0;
                do {
                  piVar10[lVar7] = piVar10[lVar7] + 1;
                  lVar7 = lVar7 + 1;
                } while (lVar11 != lVar7);
                bVar1 = true;
                iVar6 = iVar14;
              }
              else {
                if (!bVar1) {
                  bVar1 = false;
                  goto LAB_0081a7d4;
                }
                lVar7 = 0;
                do {
                  piVar10[lVar7] = piVar10[lVar7] + -1;
                  lVar7 = lVar7 + 1;
                } while (lVar11 != lVar7);
                iVar12 = iVar12 + 1;
                bVar1 = false;
                iVar6 = -1000;
              }
            }
            else {
              iVar12 = iVar12 + 1;
              if (bVar1) {
                iVar6 = -1000;
                iVar12 = 0;
              }
              bVar1 = false;
            }
          }
        } while (iVar12 < (int)nInequalities);
      }
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + -1;
      piVar10 = piVar10 + 1;
    } while (uVar9 != uVar17);
  }
  if (0 < (int)nInequalities) {
    uVar17 = 0;
    do {
      free(pGreaters[uVar17]);
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar8);
  }
  free(pGreaters);
  if (0 < (int)nInequalities) {
    uVar17 = 0;
    do {
      free(pSmallers[uVar17]);
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar8);
  }
  free(pSmallers);
  sVar3 = strlen(pIsop);
  if ((int)(uint)sVar3 < 1) {
    iVar6 = 1000;
  }
  else {
    iVar6 = 1000;
    lVar2 = 0;
    do {
      iVar12 = 0;
      if (0 < nVars) {
        iVar12 = 0;
        piVar10 = pChow;
        lVar11 = lVar2;
        do {
          if (pIsop[lVar11] == '1') {
            iVar12 = iVar12 + __ptr[*piVar10];
          }
          lVar11 = lVar11 + 1;
          piVar10 = piVar10 + 1;
        } while (lVar11 < lVar2 + nVars);
      }
      if (iVar6 < iVar12) {
        iVar12 = iVar6;
      }
      iVar6 = iVar12;
      lVar2 = lVar2 + uVar16;
    } while (lVar2 < (long)(ulong)((uint)sVar3 & 0x7fffffff));
  }
  sVar3 = strlen(pIsopFneg);
  if ((int)(uint)sVar3 < 1) {
    iVar12 = 0;
  }
  else {
    lVar2 = 0;
    iVar12 = 0;
    do {
      iVar13 = 0;
      if (0 < nVars) {
        iVar13 = 0;
        piVar10 = pChow;
        lVar11 = lVar2;
        do {
          if (pIsopFneg[lVar11] == '-') {
            iVar13 = iVar13 + __ptr[*piVar10];
          }
          lVar11 = lVar11 + 1;
          piVar10 = piVar10 + 1;
        } while (lVar11 < lVar2 + nVars);
      }
      if (iVar13 < iVar12) {
        iVar13 = iVar12;
      }
      iVar12 = iVar13;
      lVar2 = lVar2 + uVar16;
    } while (lVar2 < (long)(ulong)((uint)sVar3 & 0x7fffffff));
  }
  if (0 < nVars) {
    uVar8 = 0;
    do {
      pW[uVar8] = __ptr[pChow[uVar8]];
      uVar8 = uVar8 + 1;
    } while ((uint)nVars != uVar8);
  }
  free(__ptr);
  iVar13 = 0;
  if (iVar12 < iVar6) {
    iVar13 = iVar6;
  }
  return iVar13;
}

Assistant:

int Extra_ThreshAssignWeights(word * t, char * pIsop, char * pIsopFneg,
        int nVars, int * pW, int * pChow, int nChows, int Wmin) {

    int i = 0, j = 0, Lmin = 1000, Lmax = 0, Limit = nVars * 2, delta = 0,
            deltaOld = -1000, fIncremented = 0;
    //******************************
    int * pWofChow = ABC_ALLOC( int, nChows );
    int nCubesIsop = strlen(pIsop) / (nVars + 3);
    int nCubesIsopFneg = strlen(pIsopFneg) / (nVars + 3);
    int nInequalities = nCubesIsop * nCubesIsopFneg;
    unsigned long **pGreaters;
    unsigned long **pSmallers;

    pGreaters = (unsigned long **)malloc(nCubesIsop * nCubesIsopFneg * sizeof *pGreaters);
    for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
        pGreaters[i] = (unsigned long *)malloc(nChows * sizeof *pGreaters[i]);
    }
    pSmallers = (unsigned long **)malloc(nCubesIsop * nCubesIsopFneg * sizeof *pSmallers);
    for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
        pSmallers[i] = (unsigned long *)malloc(nChows * sizeof *pSmallers[i]);
    }

    //******************************
    Extra_ThreshCreateInequalities(pIsop, pIsopFneg, nVars, pWofChow, pChow,
            nChows, nInequalities, pGreaters, pSmallers);
    Extra_ThreshSimplifyInequalities(nInequalities, nChows, pGreaters,
            pSmallers);

    //initializes the weights
    pWofChow[0] = Wmin;
    for (i = 1; i < nChows; i++) {
        pWofChow[i] = pWofChow[i - 1] + 1;
    }
    i = 0;

    //assign the weights respecting the inequalities
    while (i < nChows && pWofChow[nChows - 1] <= Limit) {
        Lmin = 1000;
        Lmax = 0;

        while (j < nInequalities) {
            if (pGreaters[j][i] != 0) {
                Lmin = Extra_ThreshCubeWeightedSum3(pWofChow, nChows, pGreaters,
                        j);
                Lmax = Extra_ThreshCubeWeightedSum4(pWofChow, nChows, pSmallers,
                        j);
                delta = Lmin - Lmax;

                if (delta > 0) {
                    if (fIncremented == 1) {
                        j = 0;
                        fIncremented = 0;
                        deltaOld = -1000;
                    } else
                        j++;
                    continue;
                }
                if (delta > deltaOld) {
                    Extra_ThreshIncrementWeights(nChows, pWofChow, i);
                    deltaOld = delta;
                    fIncremented = 1;
                } else if (fIncremented == 1) {
                    Extra_ThreshDecrementWeights(nChows, pWofChow, i);
                    j++;
                    deltaOld = -1000;
                    fIncremented = 0;
                    continue;
                } else
                    j++;
            } else
                j++;

        }
        i++;
        j = 0;
    }

    //******************************
    for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
        free(pGreaters[i]);
    }
    free(pGreaters);
    for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
        free(pSmallers[i]);
    }
    free(pSmallers);
    //******************************

    i = 0;
    Lmin = 1000;
    Lmax = 0;

    //check the assigned weights in the original system
    for (j = 0; j < (int)strlen(pIsop); j += (nVars + 3))
        Lmin = Abc_MinInt(Lmin,
                Extra_ThreshCubeWeightedSum1(pWofChow, pChow, pIsop, nVars, j));
    for (j = 0; j < (int)strlen(pIsopFneg); j += (nVars + 3))
        Lmax = Abc_MaxInt(Lmax,
                Extra_ThreshCubeWeightedSum2(pWofChow, pChow, pIsopFneg, nVars,
                        j));

    for (i = 0; i < nVars; i++) {
        pW[i] = pWofChow[pChow[i]];
    }

    ABC_FREE( pWofChow );
    if (Lmin > Lmax)
        return Lmin;
    else
        return 0;
}